

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O1

FT_Error sdf_line_to(FT_26D6_Vec *to,void *user)

{
  long *plVar1;
  long lVar2;
  FT_Pos FVar3;
  FT_Error FVar4;
  SDF_Edge *edge;
  SDF_Edge *local_18;
  
  local_18 = (SDF_Edge *)0x0;
  if (to == (FT_26D6_Vec *)0x0) {
    FVar4 = 6;
  }
  else {
    plVar1 = *(long **)((long)user + 8);
    if ((*plVar1 != to->x) || (FVar4 = 0, plVar1[1] != to->y)) {
      FVar4 = sdf_edge_new(*user,&local_18);
      if (FVar4 == 0) {
        local_18->edge_type = SDF_EDGE_LINE;
        lVar2 = plVar1[1];
        (local_18->start_pos).x = *plVar1;
        (local_18->start_pos).y = lVar2;
        FVar3 = to->y;
        (local_18->end_pos).x = to->x;
        (local_18->end_pos).y = FVar3;
        local_18->next = (SDF_Edge_ *)plVar1[2];
        plVar1[2] = (long)local_18;
        lVar2 = to->y;
        *plVar1 = to->x;
        plVar1[1] = lVar2;
        FVar4 = 0;
      }
    }
  }
  return FVar4;
}

Assistant:

static FT_Error
  sdf_line_to( const FT_26D6_Vec*  to,
               void*               user )
  {
    SDF_Shape*    shape    = ( SDF_Shape* )user;
    SDF_Edge*     edge     = NULL;
    SDF_Contour*  contour  = NULL;

    FT_Error      error    = FT_Err_Ok;
    FT_Memory     memory   = shape->memory;


    if ( !to || !user )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    contour = shape->contours;

    if ( contour->last_pos.x == to->x &&
         contour->last_pos.y == to->y )
      goto Exit;

    FT_CALL( sdf_edge_new( memory, &edge ) );

    edge->edge_type = SDF_EDGE_LINE;
    edge->start_pos = contour->last_pos;
    edge->end_pos   = *to;

    edge->next        = contour->edges;
    contour->edges    = edge;
    contour->last_pos = *to;

  Exit:
    return error;
  }